

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::CommandLineInterface::Run
          (CommandLineInterface *this,int argc,char **argv)

{
  anon_class_32_4_e643f291 visitor;
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  ParseArgumentStatus PVar4;
  int iVar5;
  size_type sVar6;
  pointer pDVar7;
  pointer pMVar8;
  pointer pSVar9;
  pointer pEVar10;
  pointer pDVar11;
  type pDVar12;
  reference ppFVar13;
  reference pvVar14;
  pointer generator_context;
  ulong uVar15;
  uint32_t *puVar16;
  Arena *pAVar17;
  DescriptorProto *this_00;
  FileDescriptor *pFVar18;
  FileDescriptor *pFVar19;
  reference ppFVar20;
  Descriptor *descriptor;
  LogMessage *pLVar21;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_00;
  string_view sVar22;
  iterator iVar23;
  anon_class_16_2_e739539f visitor_00;
  LogMessage local_618;
  Voidify local_605;
  int local_604;
  value_type pFStack_600;
  int j;
  FileDescriptor *fd;
  size_t i_1;
  LogMessage local_5e8;
  Voidify local_5d1;
  undefined1 local_5d0 [8];
  FileDescriptorProto file_2;
  DescriptorPool pool;
  LogMessage local_458;
  Voidify local_441;
  string_view local_440;
  string_view local_430;
  string_view local_420;
  string_view local_410;
  pointer local_400;
  GeneratorContextImpl *directory;
  string *location;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>
  *pair;
  iterator __end2_2;
  iterator __begin2_2;
  GeneratorContextMap *__range2_2;
  unique_ptr *local_3b8;
  unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
  *generator;
  string_view local_3a0;
  string_view local_390;
  string_view local_380;
  string_view local_370;
  string_view local_360;
  undefined1 local_350 [8];
  string output_location;
  size_t i;
  GeneratorContextMap output_directories;
  undefined1 local_2e8 [8];
  FileDescriptorProto proto;
  FileDescriptor *file_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range2_1;
  FileDescriptor **file;
  iterator __end2;
  iterator __begin2;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range2;
  ErrorCollector *pEStack_198;
  bool validation_error;
  pointer local_190;
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  local_188;
  pointer local_180;
  pointer local_178;
  unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
  local_170;
  pointer local_168;
  unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
  local_160;
  unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
  local_158;
  pointer local_150;
  ErrorPrinter *local_148;
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  local_140;
  unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
  local_138;
  vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  local_130;
  unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
  *db;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  *__range3_1;
  vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  raw_databases_per_descriptor_set;
  value_type local_d8;
  unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
  database_for_descriptor_set;
  string *name;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
  source_tree_database;
  unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
  descriptor_set_in_database;
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  databases_per_descriptor_set;
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  descriptor_pool;
  unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
  error_collector;
  unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
  disk_source_tree;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  char **argv_local;
  int argc_local;
  CommandLineInterface *this_local;
  
  Clear(this);
  PVar4 = ParseArguments(this,argc,argv);
  if (PVar4 != PARSE_ARGUMENT_DONE_AND_CONTINUE) {
    if (PVar4 == PARSE_ARGUMENT_DONE_AND_EXIT) {
      return 0;
    }
    if (PVar4 == PARSE_ARGUMENT_FAIL) {
      return 1;
    }
  }
  std::
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            *)&disk_source_tree);
  std::
  unique_ptr<google::protobuf::compiler::DiskSourceTree,std::default_delete<google::protobuf::compiler::DiskSourceTree>>
  ::unique_ptr<std::default_delete<google::protobuf::compiler::DiskSourceTree>,void>
            ((unique_ptr<google::protobuf::compiler::DiskSourceTree,std::default_delete<google::protobuf::compiler::DiskSourceTree>>
              *)&error_collector);
  std::
  unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>>
  ::
  unique_ptr<std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>,void>
            ((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>>
              *)&descriptor_pool);
  std::
  unique_ptr<google::protobuf::DescriptorPool,std::default_delete<google::protobuf::DescriptorPool>>
  ::unique_ptr<std::default_delete<google::protobuf::DescriptorPool>,void>
            ((unique_ptr<google::protobuf::DescriptorPool,std::default_delete<google::protobuf::DescriptorPool>>
              *)&databases_per_descriptor_set.
                 super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ::vector((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
            *)&descriptor_set_in_database);
  std::
  unique_ptr<google::protobuf::MergedDescriptorDatabase,std::default_delete<google::protobuf::MergedDescriptorDatabase>>
  ::unique_ptr<std::default_delete<google::protobuf::MergedDescriptorDatabase>,void>
            ((unique_ptr<google::protobuf::MergedDescriptorDatabase,std::default_delete<google::protobuf::MergedDescriptorDatabase>>
              *)&source_tree_database);
  std::
  unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>>
  ::unique_ptr<std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>,void>
            ((unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>>
              *)&__range3);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->descriptor_set_in_names_);
  if (!bVar3) {
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->descriptor_set_in_names_);
    name = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->descriptor_set_in_names_);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&name), bVar3) {
      database_for_descriptor_set._M_t.
      super___uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
      .super__Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false>._M_head_impl =
           (__uniq_ptr_data<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>,_true,_true>
            )__gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end3);
      anon_unknown_5::PopulateSingleSimpleDescriptorDatabase
                ((anon_unknown_5 *)&local_d8,
                 (string *)
                 database_for_descriptor_set._M_t.
                 super___uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                 .super__Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false>.
                 _M_head_impl);
      bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_d8);
      if (bVar3) {
        std::
        vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
        ::push_back((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                     *)&descriptor_set_in_database,&local_d8);
      }
      else {
        this_local._4_4_ = 1;
      }
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = !bVar3;
      std::
      unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
      ::~unique_ptr(&local_d8);
      if ((uint)raw_databases_per_descriptor_set.
                super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_0024d9e8;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ::vector((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              *)&__range3_1);
    sVar6 = std::
            vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
            ::size((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                    *)&descriptor_set_in_database);
    std::
    vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ::reserve((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
               *)&__range3_1,sVar6);
    __end3_1 = std::
               vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
               ::begin((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                        *)&descriptor_set_in_database);
    db = (unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
          *)std::
            vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
            ::end((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                   *)&descriptor_set_in_database);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_*,_std::vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>_>
                               *)&db), bVar3) {
      local_130.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_*,_std::vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>_>
                    ::operator*(&__end3_1);
      local_130.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)std::
                    unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                    ::get((unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                           *)local_130.
                             super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ::push_back((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                   *)&__range3_1,
                  (value_type *)
                  &local_130.
                   super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_*,_std::vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>_>
      ::operator++(&__end3_1);
    }
    std::
    make_unique<google::protobuf::MergedDescriptorDatabase,std::vector<google::protobuf::DescriptorDatabase*,std::allocator<google::protobuf::DescriptorDatabase*>>&>
              (&local_130);
    std::
    unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
    ::operator=((unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
                 *)&source_tree_database,
                (unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
                 *)&local_130);
    std::
    unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
    ::~unique_ptr((unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
                   *)&local_130);
    std::
    vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ::~vector((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
               *)&__range3_1);
  }
  bVar3 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->proto_path_);
  if (bVar3) {
    pMVar8 = std::
             unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
             ::get((unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
                    *)&source_tree_database);
    bVar3 = VerifyInputFilesInDescriptors(this,&pMVar8->super_DescriptorDatabase);
    if (!bVar3) {
      this_local._4_4_ = 1;
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      goto LAB_0024d9e8;
    }
    std::
    make_unique<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,google::protobuf::compiler::CommandLineInterface::ErrorFormat&>
              ((ErrorFormat *)&local_138);
    std::
    unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
    ::operator=((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                 *)&descriptor_pool,&local_138);
    std::
    unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
    ::~unique_ptr(&local_138);
    local_148 = (ErrorPrinter *)
                std::
                unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
                ::get((unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
                       *)&source_tree_database);
    local_150 = std::
                unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                ::get((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                       *)&descriptor_pool);
    std::
    make_unique<google::protobuf::DescriptorPool,google::protobuf::MergedDescriptorDatabase*,google::protobuf::compiler::CommandLineInterface::ErrorPrinter*>
              ((MergedDescriptorDatabase **)&local_140,&local_148);
    std::
    unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
    ::operator=((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                 *)&databases_per_descriptor_set.
                    super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_140);
    std::
    unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
    ::~unique_ptr(&local_140);
  }
  else {
    std::make_unique<google::protobuf::compiler::DiskSourceTree>();
    std::
    unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
    ::operator=((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                 *)&error_collector,&local_158);
    std::
    unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
    ::~unique_ptr(&local_158);
    pDVar7 = std::
             unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
             ::get((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                    *)&error_collector);
    pMVar8 = std::
             unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
             ::get((unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
                    *)&source_tree_database);
    bVar3 = InitializeDiskSourceTree(this,pDVar7,&pMVar8->super_DescriptorDatabase);
    if (!bVar3) {
      this_local._4_4_ = 1;
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      goto LAB_0024d9e8;
    }
    local_168 = std::
                unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                ::get((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                       *)&error_collector);
    std::
    make_unique<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,google::protobuf::compiler::CommandLineInterface::ErrorFormat&,google::protobuf::compiler::DiskSourceTree*>
              ((ErrorFormat *)&local_160,(DiskSourceTree **)&this->error_format_);
    std::
    unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
    ::operator=((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                 *)&descriptor_pool,&local_160);
    std::
    unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
    ::~unique_ptr(&local_160);
    local_178 = std::
                unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                ::get((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                       *)&error_collector);
    local_180 = std::
                unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
                ::get((unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
                       *)&source_tree_database);
    std::
    make_unique<google::protobuf::compiler::SourceTreeDescriptorDatabase,google::protobuf::compiler::DiskSourceTree*,google::protobuf::MergedDescriptorDatabase*>
              ((DiskSourceTree **)&local_170,(MergedDescriptorDatabase **)&local_178);
    std::
    unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
    ::operator=((unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
                 *)&__range3,&local_170);
    std::
    unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
    ::~unique_ptr(&local_170);
    pSVar9 = std::
             unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
             ::operator->((unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
                           *)&__range3);
    pEVar10 = std::
              unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
              ::get((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                     *)&descriptor_pool);
    SourceTreeDescriptorDatabase::RecordErrorsTo(pSVar9,&pEVar10->super_MultiFileErrorCollector);
    local_190 = std::
                unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
                ::get((unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
                       *)&__range3);
    pSVar9 = std::
             unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
             ::operator->((unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
                           *)&__range3);
    pEStack_198 = SourceTreeDescriptorDatabase::GetValidationErrorCollector(pSVar9);
    std::
    make_unique<google::protobuf::DescriptorPool,google::protobuf::compiler::SourceTreeDescriptorDatabase*,google::protobuf::DescriptorPool::ErrorCollector*>
              ((SourceTreeDescriptorDatabase **)&local_188,(ErrorCollector **)&local_190);
    std::
    unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
    ::operator=((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                 *)&databases_per_descriptor_set.
                    super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_188);
    std::
    unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
    ::~unique_ptr(&local_188);
  }
  pDVar11 = std::
            unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
            ::operator->((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                          *)&databases_per_descriptor_set.
                             super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  DescriptorPool::EnforceWeakDependencies(pDVar11,true);
  pDVar11 = std::
            unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
            ::operator->((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                          *)&databases_per_descriptor_set.
                             super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  DescriptorPool::EnforceNamingStyle(pDVar11,true);
  pDVar12 = std::
            unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
            ::operator*((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                         *)&databases_per_descriptor_set.
                            super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar3 = SetupFeatureResolution(this,pDVar12);
  if (!bVar3) {
    this_local._4_4_ = 1;
    raw_databases_per_descriptor_set.
    super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    goto LAB_0024d9e8;
  }
  if (this->mode_ == MODE_COMPILE) {
    pDVar11 = std::
              unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
              ::operator->((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                            *)&databases_per_descriptor_set.
                               super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    DescriptorPool::EnforceExtensionDeclarations(pDVar11,kCustomExtensions);
  }
  pDVar11 = std::
            unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
            ::get((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                   *)&databases_per_descriptor_set.
                      super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pDVar7 = std::
           unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
           ::get((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                  *)&error_collector);
  parsed_files_00 =
       (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        *)&disk_source_tree;
  bVar3 = ParseInputFiles(this,pDVar11,pDVar7,parsed_files_00);
  if (!bVar3) {
    this_local._4_4_ = 1;
    raw_databases_per_descriptor_set.
    super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    goto LAB_0024d9e8;
  }
  __range2._7_1_ = 0;
  __end2 = std::
           vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)&disk_source_tree);
  file = (FileDescriptor **)
         std::
         vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         ::end((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&disk_source_tree);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                                     *)&file), bVar3) {
    ppFVar13 = __gnu_cxx::
               __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
               ::operator*(&__end2);
    visitor_00.error_collector =
         (unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
          *)parsed_files_00;
    visitor_00.validation_error = (bool *)&descriptor_pool;
    internal::
    VisitDescriptors<google::protobuf::compiler::CommandLineInterface::Run(int,char_const*const*)::__0>
              ((internal *)*ppFVar13,(FileDescriptor *)((long)&__range2 + 7),visitor_00);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::begin((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      *)&disk_source_tree);
  file_1 = (FileDescriptor *)
           std::
           vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::end((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)&disk_source_tree);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                        *)&file_1);
    if (!bVar3) break;
    ppFVar13 = __gnu_cxx::
               __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
               ::operator*(&__end2_1);
    proto.field_0._224_8_ = *ppFVar13;
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_2e8);
    FileDescriptor::CopyTo((FileDescriptor *)proto.field_0._224_8_,(FileDescriptorProto *)local_2e8)
    ;
    output_directories.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.slot_array =
         (MaybeInitializedPtr)
         &databases_per_descriptor_set.
          super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    visitor.error_collector =
         (unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
          *)&descriptor_pool;
    visitor.descriptor_pool =
         (unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
          *)output_directories.
            super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
            .
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_.heap.slot_array;
    visitor.file = (FileDescriptor **)((long)&proto.field_0 + 0xe0);
    visitor.validation_error = (bool *)((long)&__range2 + 7);
    internal::
    VisitDescriptors<google::protobuf::compiler::CommandLineInterface::Run(int,char_const*const*)::__1>
              ((FileDescriptor *)proto.field_0._224_8_,(FileDescriptorProto *)local_2e8,visitor);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_2e8);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
    ::operator++(&__end2_1);
  }
  if ((__range2._7_1_ & 1) != 0) {
    this_local._4_4_ = 1;
    raw_databases_per_descriptor_set.
    super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    goto LAB_0024d9e8;
  }
  bVar3 = EnforceProtocEditionsSupport
                    (this,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                           *)&disk_source_tree);
  if (!bVar3) {
    this_local._4_4_ = 1;
    raw_databases_per_descriptor_set.
    super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    goto LAB_0024d9e8;
  }
  absl::lts_20250127::
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
  ::flat_hash_map((flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                   *)&i);
  if (this->mode_ == MODE_COMPILE) {
    output_location.field_2._8_8_ = 0;
    while( true ) {
      uVar2 = output_location.field_2._8_8_;
      sVar6 = std::
              vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
              ::size(&this->output_directives_);
      if (sVar6 <= (ulong)uVar2) break;
      pvVar14 = std::
                vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                ::operator[](&this->output_directives_,output_location.field_2._8_8_);
      std::__cxx11::string::string((string *)local_350,(string *)&pvVar14->output_location);
      sVar22 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_350);
      local_360 = sVar22;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_370,".zip");
      bVar3 = absl::lts_20250127::EndsWith(local_360,local_370);
      if (!bVar3) {
        sVar22 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_350);
        local_380 = sVar22;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_390,".jar");
        bVar3 = absl::lts_20250127::EndsWith(local_380,local_390);
        if (!bVar3) {
          sVar22 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_350);
          local_3a0 = sVar22;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&generator,".srcjar");
          bVar3 = absl::lts_20250127::EndsWith(local_3a0,_generator);
          if (!bVar3) {
            anon_unknown_5::AddTrailingSlash((string *)local_350);
          }
        }
      }
      local_3b8 = (unique_ptr *)
                  absl::lts_20250127::container_internal::
                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>>>
                  ::
                  operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>>
                            ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>>>
                              *)&i,(key_arg<std::__cxx11::basic_string<char>_> *)local_350);
      bVar3 = std::unique_ptr::operator_cast_to_bool(local_3b8);
      if (!bVar3) {
        std::
        make_unique<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>&>
                  ((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)&__range2_2);
        std::
        unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
        ::operator=((unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                     *)local_3b8,
                    (unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                     *)&__range2_2);
        std::
        unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
        ::~unique_ptr((unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                       *)&__range2_2);
      }
      pvVar14 = std::
                vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                ::operator[](&this->output_directives_,output_location.field_2._8_8_);
      generator_context =
           std::
           unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
           ::get((unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                  *)local_3b8);
      bVar3 = GenerateOutput(this,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                   *)&disk_source_tree,pvVar14,
                             &generator_context->super_GeneratorContext);
      if (!bVar3) {
        this_local._4_4_ = 1;
      }
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = !bVar3;
      std::__cxx11::string::~string((string *)local_350);
      if ((uint)raw_databases_per_descriptor_set.
                super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_0024d9cc;
      output_location.field_2._8_8_ = output_location.field_2._8_8_ + 1;
    }
  }
  iVar23 = absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
           ::begin((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                    *)&i);
  __end2_2.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)iVar23.ctrl_;
  iVar23 = absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
           ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                  *)&i);
  while( true ) {
    __end2_2.ctrl_ = (ctrl_t *)iVar23.field_1;
    pair = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>
            *)iVar23.ctrl_;
    bVar3 = absl::lts_20250127::container_internal::operator!=
                      ((iterator *)&__end2_2.field_1,(iterator *)&pair);
    if (!bVar3) break;
    directory = (GeneratorContextImpl *)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                ::iterator::operator*((iterator *)&__end2_2.field_1);
    location = (string *)directory;
    local_400 = std::
                unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                ::get((unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                       *)&directory->parsed_files_);
    sVar22 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)directory);
    local_410 = sVar22;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_420,"/");
    bVar3 = absl::lts_20250127::EndsWith(local_410,local_420);
    if (bVar3) {
      bVar3 = GeneratorContextImpl::WriteAllToDisk(local_400,(string *)directory);
      if (!bVar3) {
        this_local._4_4_ = 1;
        raw_databases_per_descriptor_set.
        super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        goto LAB_0024d9cc;
      }
    }
    else {
      sVar22 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)directory);
      local_430 = sVar22;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_440,".jar");
      bVar3 = absl::lts_20250127::EndsWith(local_430,local_440);
      if (bVar3) {
        GeneratorContextImpl::AddJarManifest(local_400);
      }
      bVar3 = GeneratorContextImpl::WriteAllToZip(local_400,(string *)directory);
      if (!bVar3) {
        this_local._4_4_ = 1;
        raw_databases_per_descriptor_set.
        super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        goto LAB_0024d9cc;
      }
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
    ::iterator::operator++((iterator *)&__end2_2.field_1);
    iVar23.field_1.slot_ = (slot_type *)__end2_2.ctrl_;
    iVar23.ctrl_ = (ctrl_t *)pair;
  }
  uVar15 = std::__cxx11::string::empty();
  if ((uVar15 & 1) == 0) {
    pDVar7 = std::
             unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
             ::get((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                    *)&error_collector);
    if (pDVar7 == (pointer)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_458,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0x55f,"disk_source_tree.get()");
      pLVar21 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_458);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_441,pLVar21);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_458);
    }
    pDVar7 = std::
             unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
             ::get((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                    *)&error_collector);
    bVar3 = GenerateDependencyManifestFile
                      (this,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                             *)&disk_source_tree,(GeneratorContextMap *)&i,pDVar7);
    if (bVar3) goto LAB_0024d35e;
    this_local._4_4_ = 1;
    raw_databases_per_descriptor_set.
    super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    goto LAB_0024d9cc;
  }
LAB_0024d35e:
  uVar15 = std::__cxx11::string::empty();
  if ((uVar15 & 1) == 0) {
    bVar3 = WriteDescriptorSet(this,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                     *)&disk_source_tree);
    if (!bVar3) {
      this_local._4_4_ = 1;
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      goto LAB_0024d9cc;
    }
  }
  uVar15 = std::__cxx11::string::empty();
  if ((uVar15 & 1) == 0) {
    pDVar12 = std::
              unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
              ::operator*((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                           *)&databases_per_descriptor_set.
                              super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar3 = WriteEditionDefaults(this,pDVar12);
    if (!bVar3) {
      this_local._4_4_ = 1;
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      goto LAB_0024d9cc;
    }
  }
  if ((this->mode_ == MODE_ENCODE) || (this->mode_ == MODE_DECODE)) {
    uVar15 = std::__cxx11::string::empty();
    if ((uVar15 & 1) == 0) {
      pDVar11 = std::
                unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                ::get((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                       *)&databases_per_descriptor_set.
                          super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = EncodeOrDecode(this,pDVar11);
      if (bVar3) goto LAB_0024d77e;
      this_local._4_4_ = 1;
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    else {
      DescriptorPool::DescriptorPool((DescriptorPool *)((long)&file_2.field_0 + 0xe0));
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_5d0);
      puVar16 = internal::HasBits<1>::operator[]
                          ((HasBits<1> *)&file_2.super_Message.super_MessageLite._internal_metadata_
                           ,0);
      *(byte *)puVar16 = (byte)*puVar16 | 1;
      pAVar17 = MessageLite::GetArena((MessageLite *)local_5d0);
      internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)
                 &file_2.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,
                 "empty_message.proto",pAVar17);
      this_00 = FileDescriptorProto::add_message_type((FileDescriptorProto *)local_5d0);
      puVar16 = internal::HasBits<1>::operator[](&(this_00->field_0)._impl_._has_bits_,0);
      *(byte *)puVar16 = (byte)*puVar16 | 1;
      pAVar17 = MessageLite::GetArena((MessageLite *)this_00);
      internal::ArenaStringPtr::Set(&(this_00->field_0)._impl_.name_,"EmptyMessage",pAVar17);
      i_1._7_1_ = 0;
      pFVar18 = DescriptorPool::BuildFile
                          ((DescriptorPool *)((long)&file_2.field_0 + 0xe0),
                           (FileDescriptorProto *)local_5d0);
      if (pFVar18 == (FileDescriptor *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_5e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                   ,0x579,"pool.BuildFile(file) != nullptr");
        i_1._7_1_ = 1;
        pLVar21 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_5e8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_5d1,pLVar21);
      }
      if ((i_1._7_1_ & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_5e8);
      }
      std::__cxx11::string::operator=((string *)&this->codec_type_,"EmptyMessage");
      bVar3 = EncodeOrDecode(this,(DescriptorPool *)((long)&file_2.field_0 + 0xe0));
      if (!bVar3) {
        this_local._4_4_ = 1;
      }
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = !bVar3;
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_5d0);
      DescriptorPool::~DescriptorPool((DescriptorPool *)((long)&file_2.field_0 + 0xe0));
      if ((uint)raw_databases_per_descriptor_set.
                super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) goto LAB_0024d77e;
    }
  }
  else {
LAB_0024d77e:
    pEVar10 = std::
              unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
              ::operator->((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                            *)&descriptor_pool);
    bVar3 = ErrorPrinter::FoundErrors(pEVar10);
    if (bVar3) {
LAB_0024d7d8:
      this_local._4_4_ = 1;
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    else {
      if ((this->fatal_warnings_ & 1U) != 0) {
        pEVar10 = std::
                  unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                  ::operator->((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                                *)&descriptor_pool);
        bVar3 = ErrorPrinter::FoundWarnings(pEVar10);
        if (bVar3) goto LAB_0024d7d8;
      }
      if (this->mode_ == MODE_PRINT) {
        if (this->print_mode_ == PRINT_NONE) {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    (&local_618,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x595);
          pLVar21 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_618);
          pLVar21 = absl::lts_20250127::log_internal::LogMessage::operator<<
                              (pLVar21,(char (*) [94])
                                       "If the code reaches here, it usually means a bug of flag parsing in the CommandLineInterface."
                              );
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_605,pLVar21);
          absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_618);
          this_local._4_4_ = 1;
          raw_databases_per_descriptor_set.
          super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          goto LAB_0024d9cc;
        }
        if (this->print_mode_ == PRINT_FREE_FIELDS) {
          fd = (FileDescriptor *)0x0;
          while( true ) {
            pFVar18 = fd;
            pFVar19 = (FileDescriptor *)
                      std::
                      vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      ::size((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                              *)&disk_source_tree);
            if (pFVar19 <= pFVar18) break;
            ppFVar20 = std::
                       vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       ::operator[]((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                     *)&disk_source_tree,(size_type)fd);
            pFStack_600 = *ppFVar20;
            local_604 = 0;
            while( true ) {
              iVar1 = local_604;
              iVar5 = FileDescriptor::message_type_count(pFStack_600);
              if (iVar5 <= iVar1) break;
              descriptor = FileDescriptor::message_type(pFStack_600,local_604);
              PrintFreeFieldNumbers(this,descriptor);
              local_604 = local_604 + 1;
            }
            fd = (FileDescriptor *)&fd->is_placeholder_;
          }
        }
      }
      this_local._4_4_ = 0;
      raw_databases_per_descriptor_set.
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
  }
LAB_0024d9cc:
  absl::lts_20250127::
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
  ::~flat_hash_map((flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                    *)&i);
LAB_0024d9e8:
  std::
  unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
  ::~unique_ptr((unique_ptr<google::protobuf::compiler::SourceTreeDescriptorDatabase,_std::default_delete<google::protobuf::compiler::SourceTreeDescriptorDatabase>_>
                 *)&__range3);
  std::
  unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
  ::~unique_ptr((unique_ptr<google::protobuf::MergedDescriptorDatabase,_std::default_delete<google::protobuf::MergedDescriptorDatabase>_>
                 *)&source_tree_database);
  std::
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ::~vector((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
             *)&descriptor_set_in_database);
  std::
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ::~unique_ptr((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                 *)&databases_per_descriptor_set.
                    super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
  ::~unique_ptr((unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                 *)&descriptor_pool);
  std::
  unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
  ::~unique_ptr((unique_ptr<google::protobuf::compiler::DiskSourceTree,_std::default_delete<google::protobuf::compiler::DiskSourceTree>_>
                 *)&error_collector);
  std::
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             *)&disk_source_tree);
  return this_local._4_4_;
}

Assistant:

int CommandLineInterface::Run(int argc, const char* const argv[]) {
  Clear();

  switch (ParseArguments(argc, argv)) {
    case PARSE_ARGUMENT_DONE_AND_EXIT:
      return 0;
    case PARSE_ARGUMENT_FAIL:
      return 1;
    case PARSE_ARGUMENT_DONE_AND_CONTINUE:
      break;
  }

  std::vector<const FileDescriptor*> parsed_files;
  std::unique_ptr<DiskSourceTree> disk_source_tree;
  std::unique_ptr<ErrorPrinter> error_collector;
  std::unique_ptr<DescriptorPool> descriptor_pool;

  // The SimpleDescriptorDatabases here are the constituents of the
  // MergedDescriptorDatabase descriptor_set_in_database, so this vector is for
  // managing their lifetimes. Its scope should match descriptor_set_in_database
  std::vector<std::unique_ptr<SimpleDescriptorDatabase>>
      databases_per_descriptor_set;
  std::unique_ptr<MergedDescriptorDatabase> descriptor_set_in_database;

  std::unique_ptr<SourceTreeDescriptorDatabase> source_tree_database;

  // Any --descriptor_set_in FileDescriptorSet objects will be used as a
  // fallback to input_files on command line, so create that db first.
  if (!descriptor_set_in_names_.empty()) {
    for (const std::string& name : descriptor_set_in_names_) {
      std::unique_ptr<SimpleDescriptorDatabase> database_for_descriptor_set =
          PopulateSingleSimpleDescriptorDatabase(name);
      if (!database_for_descriptor_set) {
        return EXIT_FAILURE;
      }
      databases_per_descriptor_set.push_back(
          std::move(database_for_descriptor_set));
    }

    std::vector<DescriptorDatabase*> raw_databases_per_descriptor_set;
    raw_databases_per_descriptor_set.reserve(
        databases_per_descriptor_set.size());
    for (const std::unique_ptr<SimpleDescriptorDatabase>& db :
         databases_per_descriptor_set) {
      raw_databases_per_descriptor_set.push_back(db.get());
    }
    descriptor_set_in_database = std::make_unique<MergedDescriptorDatabase>(
        raw_databases_per_descriptor_set);
  }

  if (proto_path_.empty()) {
    // If there are no --proto_path flags, then just look in the specified
    // --descriptor_set_in files.  But first, verify that the input files are
    // there.
    if (!VerifyInputFilesInDescriptors(descriptor_set_in_database.get())) {
      return 1;
    }

    error_collector = std::make_unique<ErrorPrinter>(error_format_);
    descriptor_pool = std::make_unique<DescriptorPool>(
        descriptor_set_in_database.get(), error_collector.get());
  } else {
    disk_source_tree = std::make_unique<DiskSourceTree>();
    if (!InitializeDiskSourceTree(disk_source_tree.get(),
                                  descriptor_set_in_database.get())) {
      return 1;
    }

    error_collector =
        std::make_unique<ErrorPrinter>(error_format_, disk_source_tree.get());

    source_tree_database = std::make_unique<SourceTreeDescriptorDatabase>(
        disk_source_tree.get(), descriptor_set_in_database.get());
    source_tree_database->RecordErrorsTo(error_collector.get());

    descriptor_pool = std::make_unique<DescriptorPool>(
        source_tree_database.get(),
        source_tree_database->GetValidationErrorCollector());
  }

  descriptor_pool->EnforceWeakDependencies(true);
  descriptor_pool->EnforceNamingStyle(true);

  if (!SetupFeatureResolution(*descriptor_pool)) {
    return EXIT_FAILURE;
  }

  // Enforce extension declarations only when compiling. We want to skip this
  // enforcement when protoc is just being invoked to encode or decode
  // protos. If allowlist is disabled, we will not check for descriptor
  // extensions declarations, either.
  if (mode_ == MODE_COMPILE) {
      descriptor_pool->EnforceExtensionDeclarations(
          ExtDeclEnforcementLevel::kCustomExtensions);
  }
  if (!ParseInputFiles(descriptor_pool.get(), disk_source_tree.get(),
                       &parsed_files)) {
    return 1;
  }

  bool validation_error = false;  // Defer exiting so we log more warnings.

  for (auto& file : parsed_files) {
    google::protobuf::internal::VisitDescriptors(
        *file, [&](const FieldDescriptor& field) {
          if (HasReservedFieldNumber(&field)) {
            const char* error_link = nullptr;
            validation_error = true;
            std::string error;
            if (field.number() >= FieldDescriptor::kFirstReservedNumber &&
                field.number() <= FieldDescriptor::kLastReservedNumber) {
              error = absl::Substitute(
                  "Field numbers $0 through $1 are reserved "
                  "for the protocol buffer library implementation.",
                  FieldDescriptor::kFirstReservedNumber,
                  FieldDescriptor::kLastReservedNumber);
            } else {
              error = absl::Substitute(
                  "Field number $0 is reserved for specific purposes.",
                  field.number());
            }
            if (error_link) {
              absl::StrAppend(&error, "(See ", error_link, ")");
            }
            static_cast<DescriptorPool::ErrorCollector*>(error_collector.get())
                ->RecordError(field.file()->name(), field.full_name(), nullptr,
                              DescriptorPool::ErrorCollector::NUMBER, error);
          }
        });
  }

  // We visit one file at a time because we need to provide the file name for
  // error messages. Usually we can get the file name from any descriptor with
  // something like descriptor->file()->name(), but ExtensionRange does not
  // support this.
  for (const google::protobuf::FileDescriptor* file : parsed_files) {
    FileDescriptorProto proto;
    file->CopyTo(&proto);
    google::protobuf::internal::VisitDescriptors(
        *file, proto, [&](const auto& descriptor, const auto& proto) {
          if (!ValidateTargetConstraints(proto.options(), *descriptor_pool,
                                         *error_collector, file->name(),
                                         GetTargetType(&descriptor))) {
            validation_error = true;
          }
        });
  }


  if (validation_error) {
    return 1;
  }

  if (!EnforceProtocEditionsSupport(parsed_files)) {
    return 1;
  }

  // We construct a separate GeneratorContext for each output location.  Note
  // that two code generators may output to the same location, in which case
  // they should share a single GeneratorContext so that OpenForInsert() works.
  GeneratorContextMap output_directories;

  // Generate output.
  if (mode_ == MODE_COMPILE) {
    for (size_t i = 0; i < output_directives_.size(); ++i) {
      std::string output_location = output_directives_[i].output_location;
      if (!absl::EndsWith(output_location, ".zip") &&
          !absl::EndsWith(output_location, ".jar") &&
          !absl::EndsWith(output_location, ".srcjar")) {
        AddTrailingSlash(&output_location);
      }

      auto& generator = output_directories[output_location];

      if (!generator) {
        // First time we've seen this output location.
        generator = std::make_unique<GeneratorContextImpl>(parsed_files);
      }

      if (!GenerateOutput(parsed_files, output_directives_[i],
                          generator.get())) {
        return 1;
      }
    }
  }

  for (const auto& pair : output_directories) {
    const std::string& location = pair.first;
    GeneratorContextImpl* directory = pair.second.get();
    if (absl::EndsWith(location, "/")) {
      if (!directory->WriteAllToDisk(location)) {
        return 1;
      }
    } else {
      if (absl::EndsWith(location, ".jar")) {
        directory->AddJarManifest();
      }

      if (!directory->WriteAllToZip(location)) {
        return 1;
      }
    }
  }

  if (!dependency_out_name_.empty()) {
    ABSL_DCHECK(disk_source_tree.get());
    if (!GenerateDependencyManifestFile(parsed_files, output_directories,
                                        disk_source_tree.get())) {
      return 1;
    }
  }

  if (!descriptor_set_out_name_.empty()) {
    if (!WriteDescriptorSet(parsed_files)) {
      return 1;
    }
  }

  if (!edition_defaults_out_name_.empty()) {
    if (!WriteEditionDefaults(*descriptor_pool)) {
      return 1;
    }
  }

  if (mode_ == MODE_ENCODE || mode_ == MODE_DECODE) {
    if (codec_type_.empty()) {
      // HACK:  Define an EmptyMessage type to use for decoding.
      DescriptorPool pool;
      FileDescriptorProto file;
      file.set_name("empty_message.proto");
      file.add_message_type()->set_name("EmptyMessage");
      ABSL_CHECK(pool.BuildFile(file) != nullptr);
      codec_type_ = "EmptyMessage";
      if (!EncodeOrDecode(&pool)) {
        return 1;
      }
    } else {
      if (!EncodeOrDecode(descriptor_pool.get())) {
        return 1;
      }
    }
  }

  if (error_collector->FoundErrors() ||
      (fatal_warnings_ && error_collector->FoundWarnings())) {
    return 1;
  }

  if (mode_ == MODE_PRINT) {
    switch (print_mode_) {
      case PRINT_FREE_FIELDS:
        for (size_t i = 0; i < parsed_files.size(); ++i) {
          const FileDescriptor* fd = parsed_files[i];
          for (int j = 0; j < fd->message_type_count(); ++j) {
            PrintFreeFieldNumbers(fd->message_type(j));
          }
        }
        break;
      case PRINT_NONE:
        ABSL_LOG(ERROR)
            << "If the code reaches here, it usually means a bug of "
               "flag parsing in the CommandLineInterface.";
        return 1;

        // Do not add a default case.
    }
  }
  return 0;
}